

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

int __thiscall
OpenMD::ForceMatrixDecomposition::getTopologicalDistance
          (ForceMatrixDecomposition *this,int atom1,int atom2)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  uint j;
  ulong uVar4;
  
  pvVar1 = (this->super_ForceDecomposition).toposForAtom.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data;
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar1[atom1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= uVar4) {
      return 0;
    }
    uVar3 = (ulong)((int)uVar4 + 1);
  } while (*(int *)(lVar2 + uVar4 * 4) != atom2);
  return *(int *)(*(long *)&(this->super_ForceDecomposition).topoDist.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[atom1].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + uVar4 * 4);
}

Assistant:

int ForceMatrixDecomposition::getTopologicalDistance(int atom1, int atom2) {
    for (unsigned int j = 0; j < toposForAtom[atom1].size(); j++) {
      if (toposForAtom[atom1][j] == atom2) return topoDist[atom1][j];
    }
    return 0;
  }